

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrLDA0xa9(CPU *this)

{
  uint16_t addr;
  uint8_t uVar1;
  byte bVar2;
  
  addr = this->PC;
  this->PC = addr + 1;
  uVar1 = Memory::Read8(this->m,addr);
  this->A = uVar1;
  if (uVar1 == '\0') {
    bVar2 = this->field_0x2e | 0x40;
  }
  else {
    bVar2 = this->field_0x2e & 0xbf;
    if ((char)uVar1 < '\0') {
      bVar2 = bVar2 | 1;
      goto LAB_0010e944;
    }
  }
  bVar2 = bVar2 & 0xfe;
LAB_0010e944:
  this->field_0x2e = bVar2;
  return 2;
}

Assistant:

int CPU::instrLDA0xa9() {
	LDA(immediate_addr());
	return 2;
}